

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall ParserProbModelXML::ReadLRFs(ParserProbModelXML *this)

{
  bool bVar1;
  undefined8 uVar2;
  reference pvVar3;
  Scope *O_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys_00;
  Scope *Y_00;
  FactoredDecPOMDPDiscrete *this_00;
  void *pvVar4;
  Scope *pSVar5;
  mapped_type *pmVar6;
  xmlNodePtr pxVar7;
  size_type sVar8;
  RewardModelMapping *pRVar9;
  reference pvVar10;
  long in_RDI;
  reference rVar11;
  pair<unsigned_int,_unsigned_long> pVar12;
  Index jaI;
  size_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_AsAll;
  vector<unsigned_int,_std::allocator<unsigned_int>_> AsAll;
  Scope jaScope;
  size_t k_1;
  double r;
  size_t k;
  int j_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  t1_deps;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  t0_deps;
  RewardModelMapping *RMe;
  size_t nrAIs;
  size_t nrXIs;
  string ag_descr;
  string sf_descr;
  Scope *agSC;
  Scope *sfSC;
  vector<unsigned_int,_std::allocator<unsigned_int>_> factor_values;
  int timeslice;
  string var_name;
  xmlNodePtr node;
  size_t size;
  int j;
  int nValues;
  vector<bool,_std::allocator<bool>_> factor_times;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  factor_names;
  vector<unsigned_long,_std::allocator<unsigned_long>_> factor_sizes;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ptr_values;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Os;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys;
  vector<unsigned_int,_std::allocator<unsigned_int>_> As;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs;
  Scope O;
  Scope Y;
  Scope A;
  Scope X;
  xmlNodeSetPtr var_nodeset;
  xmlXPathObjectPtr vars;
  Index LRFix;
  pair<ParserProbModelXML::elm_type,_unsigned_int> elm;
  string utility_var_name;
  xmlXPathObjectPtr utility_var_node;
  int i;
  xmlNodeSetPtr potentials_nodeset;
  xmlXPathObjectPtr reward_potentials;
  xmlChar *xpath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_fffffffffffff928;
  Index IVar13;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffff930;
  xmlNodePtr in_stack_fffffffffffff938;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffff940;
  ParserProbModelXML *in_stack_fffffffffffff948;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff950;
  string *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  uint in_stack_fffffffffffff96c;
  xmlNodePtr in_stack_fffffffffffff970;
  Index in_stack_fffffffffffff978;
  value_type in_stack_fffffffffffff97c;
  RewardModelMapping *in_stack_fffffffffffff980;
  size_type in_stack_fffffffffffff988;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff990;
  xmlNodePtr in_stack_fffffffffffff9a0;
  ParserProbModelXML *in_stack_fffffffffffff9a8;
  double in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  uint in_stack_fffffffffffff9ec;
  _Bit_type in_stack_fffffffffffff9f0;
  _Bit_type *in_stack_fffffffffffff9f8;
  Scope *X_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Os_00;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffffa50;
  undefined1 local_558 [16];
  xmlDocPtr local_548;
  _Base_ptr in_stack_fffffffffffffad8;
  undefined1 local_519 [68];
  undefined1 local_4d5 [53];
  xmlNodePtr local_4a0;
  string local_438 [32];
  ParserProbModelXML *local_418;
  pair<unsigned_int,_unsigned_long> local_410;
  pair<unsigned_int,_unsigned_long> local_400;
  reference local_3f0;
  Scope *local_3e0;
  int local_3d4;
  void *local_370;
  FactoredDecPOMDPDiscrete *local_368;
  size_t local_360;
  string local_358 [32];
  string local_338 [32];
  Scope *local_318;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_310;
  undefined1 local_305 [36];
  undefined1 local_2e1;
  undefined1 *local_2a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  int local_27c;
  string local_278 [32];
  pair<ParserProbModelXML::elm_type,_unsigned_int> local_258;
  string local_250 [31];
  undefined1 in_stack_fffffffffffffdcf;
  xmlNodePtr in_stack_fffffffffffffdd0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_fffffffffffffdd8;
  int iVar14;
  int iVar15;
  ParserProbModelXML *in_stack_fffffffffffffde8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  local_1c0;
  undefined1 local_1a8 [48];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  undefined1 local_160 [24];
  undefined1 local_148 [48];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118 [2];
  undefined8 local_e8;
  xmlXPathObjectPtr local_e0;
  uint local_d8;
  undefined1 local_d1;
  string local_90 [32];
  pair<ParserProbModelXML::elm_type,_unsigned_int> local_70;
  pair<ParserProbModelXML::elm_type,_unsigned_int> local_68;
  string local_60 [32];
  xmlXPathObjectPtr local_40;
  int local_34;
  xmlNodeSetPtr local_30;
  xmlXPathObjectPtr local_18;
  char *local_10;
  
  FactoredDecPOMDPDiscrete::InitializeInstantiationInformation(in_stack_fffffffffffffa50);
  local_10 = "/ProbModelXML/ProbNet/Potentials/Potential[@role=\'utility\']";
  local_18 = GetNodesMatchingExpression
                       (in_stack_fffffffffffff948,(xmlChar *)in_stack_fffffffffffff940,
                        in_stack_fffffffffffff938);
  rVar11._M_mask = in_stack_fffffffffffff9f0;
  rVar11._M_p = in_stack_fffffffffffff9f8;
  if (local_18 == (xmlXPathObjectPtr)0x0) {
    uVar2 = __cxa_allocate_exception(0x28);
    EParse::EParse((EParse *)in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928);
    __cxa_throw(uVar2,&EParse::typeinfo,EParse::~EParse);
  }
  local_30 = local_18->nodesetval;
  local_34 = 0;
  while( true ) {
    if (local_30->nodeNr <= local_34) {
      xmlXPathFreeObject(local_18);
      return;
    }
    local_40 = GetNodesMatchingExpression
                         (in_stack_fffffffffffff948,(xmlChar *)in_stack_fffffffffffff940,
                          in_stack_fffffffffffff938);
    if (local_40 == (xmlXPathObjectPtr)0x0) break;
    GetVariableName_abi_cxx11_(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    std::pair<ParserProbModelXML::elm_type,_unsigned_int>::
    pair<ParserProbModelXML::elm_type,_unsigned_int,_true>(&local_68);
    std::__cxx11::string::string(local_90,local_60);
    local_70 = GetParsedElement(in_stack_fffffffffffff9a8,(string *)in_stack_fffffffffffff9a0);
    std::pair<ParserProbModelXML::elm_type,_unsigned_int>::operator=(&local_68,&local_70);
    std::__cxx11::string::~string(local_90);
    if (local_68.first != REWARD) {
      local_d1 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff970);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930);
      EParse::EParse((EParse *)in_stack_fffffffffffff970,
                     (string *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      local_d1 = 0;
      __cxa_throw(uVar2,&EParse::typeinfo,EParse::~EParse);
    }
    local_d8 = local_68.second;
    local_e0 = GetNodesMatchingExpression
                         (in_stack_fffffffffffff948,(xmlChar *)in_stack_fffffffffffff940,
                          in_stack_fffffffffffff938);
    local_e8 = local_e0->nodesetval;
    Scope::Scope((Scope *)in_stack_fffffffffffff930);
    Scope::Scope((Scope *)in_stack_fffffffffffff930);
    Scope::Scope((Scope *)in_stack_fffffffffffff930);
    Scope::Scope((Scope *)in_stack_fffffffffffff930);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa88b55);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa88b62);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa88b6f);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa88b7c);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              *)0xa88b89);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa88b96);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xa88ba3);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0xa88bb0);
    iVar15 = 1;
    iVar14 = *(int *)local_e8;
    while (iVar14 = iVar14 + -1, -1 < iVar14) {
      in_stack_fffffffffffffdd0 = (*(xmlNodePtr **)(local_e8 + 8))[iVar14];
      GetVariableName_abi_cxx11_(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
      std::__cxx11::string::string(local_278,local_250);
      local_258 = GetParsedElement(in_stack_fffffffffffff9a8,(string *)in_stack_fffffffffffff9a0);
      std::pair<ParserProbModelXML::elm_type,_unsigned_int>::operator=(&local_68,&local_258);
      std::__cxx11::string::~string(local_278);
      if (local_68.first == STATE) {
        local_27c = GetVariableTimeslice
                              ((ParserProbModelXML *)
                               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                               in_stack_fffffffffffff970);
        in_stack_fffffffffffffdd8 =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)(**(code **)(**(long **)(in_RDI + 0x80) + 0xc0))
                          (*(long **)(in_RDI + 0x80),local_68.second);
        IVar13 = (Index)((ulong)in_stack_fffffffffffff928 >> 0x20);
        if (local_27c == 0) {
          Scope::Insert((Scope *)in_stack_fffffffffffff930,IVar13);
          local_288 = local_160;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       *)in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (in_stack_fffffffffffff990,SUB81(in_stack_fffffffffffff988 >> 0x38,0));
        }
        else {
          Scope::Insert((Scope *)in_stack_fffffffffffff930,IVar13);
          local_290 = local_1a8 + 0x18;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       *)in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (in_stack_fffffffffffff990,SUB81(in_stack_fffffffffffff988 >> 0x38,0));
        }
      }
      else if (local_68.first == ACTION) {
        if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
          in_stack_fffffffffffffdd8 =
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                *)(**(code **)(**(long **)(in_RDI + 0x80) + 0x108))
                            (*(long **)(in_RDI + 0x80),local_68.second);
        }
        else {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0xf0),(ulong)local_68.second);
          in_stack_fffffffffffffdd8 =
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                *)*pvVar3;
        }
        Scope::Insert((Scope *)in_stack_fffffffffffff930,
                      (Index)((ulong)in_stack_fffffffffffff928 >> 0x20));
        local_298 = &local_178;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (in_stack_fffffffffffff990,SUB81(in_stack_fffffffffffff988 >> 0x38,0));
      }
      else {
        if (local_68.first != OBSERVATION) {
          local_2e1 = 1;
          uVar2 = __cxa_allocate_exception(0x28);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff970);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930);
          EParse::EParse((EParse *)in_stack_fffffffffffff970,
                         (string *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          local_2e1 = 0;
          __cxa_throw(uVar2,&EParse::typeinfo,EParse::~EParse);
        }
        if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
          in_stack_fffffffffffffdd8 =
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                *)(**(code **)(**(long **)(in_RDI + 0x80) + 0x168))
                            (*(long **)(in_RDI + 0x80),local_68.second);
        }
        else {
          in_stack_fffffffffffffdd8 =
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                *)(**(code **)(**(long **)(in_RDI + 0x80) + 0x168))(*(long **)(in_RDI + 0x80),0);
        }
        Scope::Insert((Scope *)in_stack_fffffffffffff930,
                      (Index)((ulong)in_stack_fffffffffffff928 >> 0x20));
        local_2a0 = local_1a8;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (in_stack_fffffffffffff990,SUB81(in_stack_fffffffffffff988 >> 0x38,0));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff940,
                 (value_type_conflict2 *)in_stack_fffffffffffff938);
      iVar15 = iVar15 * (int)in_stack_fffffffffffffdd8;
      std::__cxx11::string::~string(local_250);
    }
    O_00 = (Scope *)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&local_1f0);
    local_305._1_4_ = 0;
    Os_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_305;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xa891e5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff950,
               (size_type)in_stack_fffffffffffff948,
               (value_type_conflict1 *)in_stack_fffffffffffff940,
               (allocator_type *)in_stack_fffffffffffff938);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xa89219);
    Ys_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            (**(code **)(**(long **)(in_RDI + 0x80) + 0x280))(*(long **)(in_RDI + 0x80),local_d8);
    local_310 = Ys_00;
    Y_00 = (Scope *)(**(code **)(**(long **)(in_RDI + 0x80) + 0x288))
                              (*(long **)(in_RDI + 0x80),local_d8);
    local_318 = Y_00;
    Scope::SoftPrint_abi_cxx11_((Scope *)in_stack_fffffffffffffad8);
    Scope::SoftPrint_abi_cxx11_((Scope *)in_stack_fffffffffffffad8);
    local_360 = FactoredDecPOMDPDiscrete::GetNrXIs
                          (in_stack_fffffffffffff930,
                           (Index)((ulong)in_stack_fffffffffffff928 >> 0x20));
    this_00 = (FactoredDecPOMDPDiscrete *)
              FactoredDecPOMDPDiscrete::GetNrAIs
                        (in_stack_fffffffffffff930,(Index)((ulong)in_stack_fffffffffffff928 >> 0x20)
                        );
    local_368 = this_00;
    pvVar4 = operator_new(0x80);
    RewardModelMapping::RewardModelMapping
              (in_stack_fffffffffffff980,
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
               (size_t)in_stack_fffffffffffff970,
               (string *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               in_stack_fffffffffffff960);
    local_370 = pvVar4;
    FactoredDecPOMDPDiscrete::SetRM
              (in_stack_fffffffffffff940,(Index)((ulong)in_stack_fffffffffffff938 >> 0x20),
               (RewardModel *)in_stack_fffffffffffff930);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           *)0xa893ae);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           *)0xa893bb);
    for (local_3d4 = 0; local_3d4 < iVar15; local_3d4 = local_3d4 + 1) {
      local_3e0 = (Scope *)0x0;
      while( true ) {
        X_00 = local_3e0;
        pSVar5 = (Scope *)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&local_1f0);
        if (pSVar5 <= X_00) break;
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffff950,(size_type)in_stack_fffffffffffff948);
        local_3f0 = rVar11;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_3f0);
        if (bVar1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_305 + 5),
                     (size_type)local_3e0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&local_1d8,(size_type)local_3e0);
          pVar12 = std::make_pair<unsigned_int&,unsigned_long&>
                             ((uint *)in_stack_fffffffffffff930,
                              (unsigned_long *)in_stack_fffffffffffff928);
          local_410.second = pVar12.second;
          local_410.first = pVar12.first;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_1f0,(size_type)local_3e0);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                 *)in_stack_fffffffffffff970,
                                (key_type *)
                                CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          std::pair<unsigned_int,unsigned_int>::operator=
                    ((pair<unsigned_int,unsigned_int> *)pmVar6,&local_410);
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_305 + 5),
                     (size_type)local_3e0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&local_1d8,(size_type)local_3e0);
          pVar12 = std::make_pair<unsigned_int&,unsigned_long&>
                             ((uint *)in_stack_fffffffffffff930,
                              (unsigned_long *)in_stack_fffffffffffff928);
          in_stack_fffffffffffff9e0 = (double)pVar12.second;
          in_stack_fffffffffffff9ec = pVar12.first;
          local_400.first = in_stack_fffffffffffff9ec;
          local_400.second = (unsigned_long)in_stack_fffffffffffff9e0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_1f0,(size_type)local_3e0);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                 *)in_stack_fffffffffffff970,
                                (key_type *)
                                CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
          std::pair<unsigned_int,unsigned_int>::operator=
                    ((pair<unsigned_int,unsigned_int> *)pmVar6,&local_400);
        }
        local_3e0 = (Scope *)((long)&(local_3e0->super_SDT).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      std::__cxx11::string::string(local_438,local_60);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      in_stack_fffffffffffff9a8 =
           (ParserProbModelXML *)
           GetPotential(in_stack_fffffffffffffde8,(string *)CONCAT44(iVar15,iVar14),
                        in_stack_fffffffffffffdd8,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                         *)in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)0xa89746);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)0xa89753);
      std::__cxx11::string::~string(local_438);
      local_4a0 = (xmlNodePtr)0x0;
      local_418 = in_stack_fffffffffffff9a8;
      while( true ) {
        in_stack_fffffffffffff9a0 = local_4a0;
        pxVar7 = (xmlNodePtr)
                 std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ::size(&local_1c0);
        IVar13 = (Index)((ulong)in_stack_fffffffffffff928 >> 0x20);
        if (pxVar7 <= in_stack_fffffffffffff9a0) break;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ::operator[](&local_1c0,(size_type)local_4a0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_305 + 5),
                   (size_type)local_4a0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff940,
                   (value_type_conflict1 *)in_stack_fffffffffffff938);
        local_4a0 = (xmlNodePtr)((long)&local_4a0->_private + 1);
      }
      if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
        in_stack_fffffffffffff940 = (FactoredDecPOMDPDiscrete *)local_1a8;
        in_stack_fffffffffffff938 = (xmlNodePtr)local_148;
        in_stack_fffffffffffff930 = (FactoredDecPOMDPDiscrete *)(local_1a8 + 0x18);
        in_stack_fffffffffffff928 =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              *)(local_148 + 0x18);
        FactoredDecPOMDPDiscrete::SetRewardForLRF
                  (this_00,(Index)((ulong)pvVar4 >> 0x20),X_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)rVar11._M_p,
                   (Scope *)rVar11._M_mask,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),Y_00,Ys_00,O_00,
                   Os_00,in_stack_fffffffffffff9e0);
      }
      else {
        Scope::Scope((Scope *)in_stack_fffffffffffff930);
        Scope::Insert((Scope *)in_stack_fffffffffffff930,IVar13);
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_178);
        if (sVar8 == 0) {
          in_stack_fffffffffffff950 = *(vector<bool,_std::allocator<bool>_> **)(in_RDI + 0x80);
          Scope::Scope((Scope *)in_stack_fffffffffffff930);
          local_558 = (undefined1  [16])0x0;
          local_548 = (xmlDocPtr)0x0;
          in_stack_fffffffffffff948 = (ParserProbModelXML *)local_558;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa89cf4);
          in_stack_fffffffffffff940 = (FactoredDecPOMDPDiscrete *)local_1a8;
          in_stack_fffffffffffff938 = (xmlNodePtr)local_148;
          in_stack_fffffffffffff930 = (FactoredDecPOMDPDiscrete *)(local_1a8 + 0x18);
          in_stack_fffffffffffff928 =
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                *)(local_148 + 0x18);
          FactoredDecPOMDPDiscrete::SetRewardForLRF
                    (this_00,(Index)((ulong)pvVar4 >> 0x20),X_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)rVar11._M_p,
                     (Scope *)rVar11._M_mask,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),Y_00,Ys_00,O_00,
                     Os_00,in_stack_fffffffffffff9e0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff940);
          Scope::~Scope((Scope *)0xa89d76);
        }
        else {
          in_stack_fffffffffffff988 =
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xf0));
          local_4d5._1_4_ = 0;
          in_stack_fffffffffffff990 = (vector<bool,_std::allocator<bool>_> *)local_4d5;
          std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xa8996c);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff950,(size_type)in_stack_fffffffffffff948,
                     (value_type_conflict1 *)in_stack_fffffffffffff940,
                     (allocator_type *)in_stack_fffffffffffff938);
          std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xa8999a);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff980,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
          local_519._33_8_ = (RewardModelMapping *)0x0;
          while( true ) {
            in_stack_fffffffffffff980 = (RewardModelMapping *)local_519._33_8_;
            pRVar9 = (RewardModelMapping *)
                     std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_118);
            if (pRVar9 <= in_stack_fffffffffffff980) break;
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (local_118,local_519._33_8_);
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (local_519 + 0x29),(ulong)*pvVar10);
            *pvVar3 = 1;
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&local_178,local_519._33_8_);
            in_stack_fffffffffffff97c = *pvVar10;
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (local_118,local_519._33_8_);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (local_4d5 + 5),(ulong)*pvVar10);
            *pvVar10 = in_stack_fffffffffffff97c;
            local_519._33_8_ =
                 (long)&(((RewardModel *)local_519._33_8_)->super_RewardModelDiscreteInterface).
                        super_QTableInterface._vptr_QTableInterface + 1;
          }
          do {
            in_stack_fffffffffffff978 =
                 IndexTools::IndividualToJointIndices
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffff948,
                            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff940);
            in_stack_fffffffffffff960 = *(string **)(in_RDI + 0x80);
            in_stack_fffffffffffff970 = (xmlNodePtr)local_519;
            in_stack_fffffffffffff96c = local_d8;
            local_519._29_4_ = in_stack_fffffffffffff978;
            std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xa89b34);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff950,(size_type)in_stack_fffffffffffff948,
                       (value_type_conflict1 *)in_stack_fffffffffffff940,
                       (allocator_type *)in_stack_fffffffffffff938);
            in_stack_fffffffffffff940 = (FactoredDecPOMDPDiscrete *)local_1a8;
            in_stack_fffffffffffff938 = (xmlNodePtr)local_148;
            in_stack_fffffffffffff930 = (FactoredDecPOMDPDiscrete *)(local_1a8 + 0x18);
            in_stack_fffffffffffff928 =
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                  *)(local_148 + 0x18);
            FactoredDecPOMDPDiscrete::SetRewardForLRF
                      (this_00,(Index)((ulong)pvVar4 >> 0x20),X_00,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)rVar11._M_p,
                       (Scope *)rVar11._M_mask,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),Y_00,Ys_00,O_00
                       ,Os_00,in_stack_fffffffffffff9e0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff940);
            std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xa89bda);
            bVar1 = IndexTools::Increment
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff960);
          } while (((bVar1 ^ 0xffU) & 1) != 0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff940);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff940);
        }
        Scope::~Scope((Scope *)0xa89db5);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa89dd6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa89de3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa89df0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa89dfd);
      IndexTools::Increment
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff960)
      ;
    }
    xmlXPathFreeObject(local_40);
    xmlXPathFreeObject(local_e0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            *)0xa89e57);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            *)0xa89e64);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_338);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff940);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0xa89e98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff940);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff940);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               *)in_stack_fffffffffffff940);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff940);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff940);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff940);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff940);
    Scope::~Scope((Scope *)0xa89f00);
    Scope::~Scope((Scope *)0xa89f0d);
    Scope::~Scope((Scope *)0xa89f1a);
    Scope::~Scope((Scope *)0xa89f27);
    std::__cxx11::string::~string(local_60);
    local_34 = local_34 + 1;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  EParse::EParse((EParse *)in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928);
  __cxa_throw(uVar2,&EParse::typeinfo,EParse::~EParse);
}

Assistant:

void ParserProbModelXML::ReadLRFs()
{
    _m_fDecPOMDP->InitializeInstantiationInformation();

    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Potentials/Potential[@role='utility']";
    xmlXPathObjectPtr reward_potentials = GetNodesMatchingExpression(xpath);

    if(reward_potentials == NULL){
        throw EParse("No reward potentials found in the model.");
    }

    xmlNodeSetPtr potentials_nodeset = reward_potentials->nodesetval;
    for(int i = 0; i < potentials_nodeset->nodeNr; i++)
    {
        xmlXPathObjectPtr utility_var_node = GetNodesMatchingExpression((xmlChar*) "UtilityVariable",potentials_nodeset->nodeTab[i]);
        if(utility_var_node == NULL)
            throw EParse("Found a reward table node with no codomain.");
            
        string utility_var_name = GetVariableName(utility_var_node->nodesetval->nodeTab[0]);

        std::pair<ParserProbModelXML::elm_type, Index> elm;
        elm = GetParsedElement(utility_var_name);
        if(elm.first != REWARD)
            throw EParse("Found a reward table defined over non-reward variable \"" + utility_var_name + "\".");
        Index LRFix = elm.second; //LRF index

        xmlXPathObjectPtr vars = GetNodesMatchingExpression((xmlChar*) "Variables/Variable",potentials_nodeset->nodeTab[i]);
        xmlNodeSetPtr var_nodeset = vars->nodesetval;

        Scope X, A, Y, O;
        vector<Index> Xs, As, Ys, Os;
        vector<vector<Index>* > ptr_values;
        vector<size_t> factor_sizes;
        vector<string> factor_names;
        vector<bool> factor_times;
        int nValues = 1;
        for(int j = var_nodeset->nodeNr-1; j >= 0; j--) //have to store everything bottom-up
        {
            size_t size;
            xmlNodePtr node = var_nodeset->nodeTab[j];
            string var_name = GetVariableName(node);
            elm = GetParsedElement(var_name);
            switch(elm.first)
            {
                case STATE:
                    {
                        int timeslice = GetVariableTimeslice(node);
                        size = _m_fDecPOMDP->GetNrValuesForFactor(elm.second);
                        if(timeslice == 0)
                        {
                            X.Insert(elm.second);
                            ptr_values.push_back(&Xs);
                            factor_times.push_back(0);
                        }
                        else
                        {
                            Y.Insert(elm.second);
                            ptr_values.push_back(&Ys);
                            factor_times.push_back(1);
                        }
                    }
                    break;
                case ACTION:
                    if(!_m_asynchronousModel){
                        size = _m_fDecPOMDP->GetNrActions(elm.second);
                    }else{
                        size = _m_ASizes[elm.second];
                    }
                    A.Insert(elm.second);
                    ptr_values.push_back(&As);
                    factor_times.push_back(0);
                    break;
                case OBSERVATION:
                    if(!_m_asynchronousModel)
                        size = _m_fDecPOMDP->GetNrObservations(elm.second);
                    else
                        size = _m_fDecPOMDP->GetNrObservations(0);
                    O.Insert(elm.second);
                    ptr_values.push_back(&Os);
                    factor_times.push_back(1);
                    break;
                default:
                    throw EParse("Reward \"" + utility_var_name + "\" depends on unrecognized factors.");
            }
            factor_names.push_back(var_name);
            factor_sizes.push_back(size);
            nValues *=size;
        }
        vector<Index> factor_values(factor_names.size(), 0);        

        const Scope& sfSC = _m_fDecPOMDP->GetStateFactorScopeForLRF(LRFix);
        const Scope& agSC = _m_fDecPOMDP->GetAgentScopeForLRF(LRFix);
        string sf_descr = sfSC.SoftPrint();
        string ag_descr = agSC.SoftPrint();
        size_t nrXIs = _m_fDecPOMDP->GetNrXIs(LRFix);
        size_t nrAIs = _m_fDecPOMDP->GetNrAIs(LRFix);
        
        RewardModelMapping* RMe = 
            new RewardModelMapping(nrXIs, nrAIs, sf_descr, ag_descr);
        _m_fDecPOMDP->SetRM(LRFix, RMe);

        map<string, pair<Index, Index> > t0_deps;
        map<string, pair<Index, Index> > t1_deps;
        for(int j = 0; j < nValues; j++)
        {
            for(size_t k = 0; k < factor_names.size(); k++)
            {
              if(factor_times[k] == 0)
                t0_deps[factor_names[k]] = make_pair(factor_values[k], factor_sizes[k]);
              else
                t1_deps[factor_names[k]] = make_pair(factor_values[k], factor_sizes[k]);
            }

            double r = GetPotential(utility_var_name, t0_deps, t1_deps, true);

            for(size_t k = 0; k < ptr_values.size(); k++)
            {
                ptr_values[k]->push_back(factor_values[k]);
            }

            if(!_m_asynchronousModel)
                _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, A, As, Y, Ys, O, Os, r);
            else{
                Scope jaScope;
                jaScope.Insert(0);
                
                if(As.size() > 0){
                    ///now we have to go over all joint actions which map to A, As...
                    vector<Index> AsAll(_m_ASizes.size(), 0);
                    vector<size_t> r_AsAll = _m_ASizes;
                    for(size_t i = 0; i < A.size(); i++){
                        r_AsAll[A[i]] = 1; ///this prevents Increment from going over the variables already in the scope.
                        AsAll[A[i]] = As[i];
                    }
                    do{
                       Index jaI = IndexTools::IndividualToJointIndices(AsAll,_m_ASizes);
                        _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, jaScope, vector<Index>(1,jaI), Y, Ys, O, Os, r);
                    }while(! IndexTools::Increment( AsAll, r_AsAll ));
                }
                else
                {
                    _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, Scope(), vector<Index>(), Y, Ys, O, Os, r);
                }
            }
                
            Xs.clear();
            As.clear();
            Ys.clear();
            Os.clear();
            if(DEBUG_PARSE)
            {
                cout << "X: " << X.SoftPrint() << "->";
                for(size_t k = 0; k < Xs.size(); k++)
                    cout << Xs[k] << " ";
                cout << endl << "Y: " << Y.SoftPrint() << "->";
                for(size_t k = 0; k < Ys.size(); k++)
                    cout << Ys[k] << " ";
                cout << endl << "A: " << A.SoftPrint() << "->";
                for(size_t k = 0; k < As.size(); k++)
                    cout << As[k] << " ";
                cout << endl << "O: " << O.SoftPrint() << "->";
                for(size_t k = 0; k < Os.size(); k++)
                    cout << Os[k] << " ";
                cout << endl;

                cout << "LRF " << LRFix << " has sf scope " << sf_descr << " and ag scope " << ag_descr << " and for indexes ";
                    for(size_t k = 0; k < factor_values.size(); k++)
                      cout << factor_values[k] << " ";
                    cout << "it has reward " << r << endl;
            }
            IndexTools::Increment(factor_values, factor_sizes);
        }

        xmlXPathFreeObject (utility_var_node);
        xmlXPathFreeObject (vars);
    }

    xmlXPathFreeObject (reward_potentials);
}